

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O0

void __thiscall Diligent::SerializedData::Free(SerializedData *this)

{
  SerializedData *this_local;
  memory_order __b;
  
  if (this->m_pAllocator != (IMemoryAllocator *)0x0) {
    (*this->m_pAllocator->_vptr_IMemoryAllocator[1])(this->m_pAllocator,this->m_Ptr);
  }
  this->m_pAllocator = (IMemoryAllocator *)0x0;
  this->m_Ptr = (void *)0x0;
  this->m_Size = 0;
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->m_Hash).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  return;
}

Assistant:

void SerializedData::Free()
{
    if (m_pAllocator != nullptr)
    {
        m_pAllocator->Free(m_Ptr);
    }

    m_pAllocator = nullptr;
    m_Ptr        = nullptr;
    m_Size       = 0;
    m_Hash.store(0);
}